

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitCallRef(FunctionValidator *this,CallRef *curr)

{
  CallRef *curr_00;
  bool bVar1;
  Module *pMVar2;
  HeapType sigType;
  bool local_49;
  bool local_39;
  BasicHeapType local_2c;
  HeapType local_28;
  BasicType local_1c;
  CallRef *local_18;
  CallRef *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (CallRef *)this;
  validateReturnCall<wasm::CallRef>(this,curr);
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasGC(&pMVar2->features);
  shouldBeTrue<wasm::CallRef*>(this,bVar1,local_18,"call_ref requires gc [--enable-gc]");
  local_1c = unreachable;
  bVar1 = wasm::Type::operator==(&local_18->target->type,&local_1c);
  local_39 = true;
  if (!bVar1) {
    bVar1 = wasm::Type::isRef(&local_18->target->type);
    local_49 = false;
    if (bVar1) {
      local_28 = wasm::Type::getHeapType(&local_18->target->type);
      local_2c = nofunc;
      local_49 = HeapType::operator==(&local_28,&local_2c);
    }
    local_39 = local_49;
  }
  if (local_39 == false) {
    bVar1 = wasm::Type::isFunction(&local_18->target->type);
    bVar1 = shouldBeTrue<wasm::CallRef*>
                      (this,bVar1,local_18,"call_ref target must be a function reference");
    curr_00 = local_18;
    if (bVar1) {
      sigType = wasm::Type::getHeapType(&local_18->target->type);
      validateCallParamsAndResult<wasm::CallRef>(this,curr_00,sigType);
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitCallRef(CallRef* curr) {
  validateReturnCall(curr);
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "call_ref requires gc [--enable-gc]");
  if (curr->target->type == Type::unreachable ||
      (curr->target->type.isRef() &&
       curr->target->type.getHeapType() == HeapType::nofunc)) {
    return;
  }
  if (shouldBeTrue(curr->target->type.isFunction(),
                   curr,
                   "call_ref target must be a function reference")) {
    validateCallParamsAndResult(curr, curr->target->type.getHeapType());
  }
}